

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O1

void tcmalloc::ThreadCache::GetThreadStats(uint64_t *total_bytes,uint64_t *class_count)

{
  long lVar1;
  int *piVar2;
  ulong uVar3;
  
  for (lVar1 = thread_heaps_; lVar1 != 0; lVar1 = *(long *)(lVar1 + 0x1020)) {
    *total_bytes = *total_bytes + (long)*(int *)(lVar1 + 0x1000);
    if ((class_count != (uint64_t *)0x0) && (DAT_0013e290 != 0)) {
      piVar2 = (int *)(lVar1 + 8);
      uVar3 = 0;
      do {
        class_count[uVar3] = class_count[uVar3] + (long)*piVar2;
        uVar3 = uVar3 + 1;
        piVar2 = piVar2 + 8;
      } while (uVar3 < DAT_0013e290);
    }
  }
  return;
}

Assistant:

void ThreadCache::GetThreadStats(uint64_t* total_bytes, uint64_t* class_count) {
  for (ThreadCache* h = thread_heaps_; h != nullptr; h = h->next_) {
    *total_bytes += h->Size();
    if (class_count) {
      for (int cl = 0; cl < Static::num_size_classes(); ++cl) {
        class_count[cl] += h->freelist_length(cl);
      }
    }
  }
}